

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_frequency_cepstral_coefficients_analysis.cc
# Opt level: O0

void __thiscall
sptk::MelFrequencyCepstralCoefficientsAnalysis::MelFrequencyCepstralCoefficientsAnalysis
          (MelFrequencyCepstralCoefficientsAnalysis *this,int fft_length,int num_channel,
          int num_order,int liftering_coefficient,double sampling_rate,double lowest_frequency,
          double highest_frequency,double floor)

{
  bool bVar1;
  reference pvVar2;
  undefined4 in_ECX;
  int in_EDX;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined4 in_R8D;
  DiscreteCosineTransform *in_XMM0_Qa;
  double dVar3;
  undefined8 in_XMM1_Qa;
  int iVar4;
  double theta;
  int m;
  double *w;
  double in_stack_00000050;
  double in_stack_00000058;
  pointer *__new_size;
  int local_54;
  
  iVar4 = (int)((ulong)in_XMM1_Qa >> 0x20);
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__MelFrequencyCepstralCoefficientsAnalysis_00137620;
  *(undefined4 *)
   &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = in_ECX;
  *(undefined4 *)
   ((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish + 4) = in_R8D;
  __new_size = &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  MelFilterBankAnalysis::MelFilterBankAnalysis
            ((MelFilterBankAnalysis *)lowest_frequency,highest_frequency._4_4_,
             highest_frequency._0_4_,floor,in_stack_00000058,in_stack_00000050,(double)w,m._3_1_);
  DiscreteCosineTransform::DiscreteCosineTransform(in_XMM0_Qa,iVar4);
  *(undefined1 *)
   &in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = 1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10a3ce);
  if ((((*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish < in_EDX) &&
       (0 < *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish + 4))) &&
      (bVar1 = MelFilterBankAnalysis::IsValid
                         ((MelFilterBankAnalysis *)
                          &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage), bVar1)) &&
     (bVar1 = DiscreteCosineTransform::IsValid((DiscreteCosineTransform *)0x10a416), bVar1)) {
    std::vector<double,_std::allocator<double>_>::resize(in_RDI,(size_type)__new_size);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 9,0);
    for (local_54 = 0;
        local_54 <
        *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish; local_54 = local_54 + 1) {
      iVar4 = *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish + 4);
      dVar3 = sin(((double)(local_54 + 1) * 3.141592653589793) /
                  (double)*(int *)((long)&(in_RDI->
                                          super__Vector_base<double,_std::allocator<double>_>).
                                          _M_impl.super__Vector_impl_data._M_finish + 4));
      pvVar2[local_54] = (double)iVar4 * 0.5 * dVar3 + 1.0;
    }
  }
  else {
    *(undefined1 *)
     &in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = 0;
  }
  return;
}

Assistant:

MelFrequencyCepstralCoefficientsAnalysis::
    MelFrequencyCepstralCoefficientsAnalysis(
        int fft_length, int num_channel, int num_order,
        int liftering_coefficient, double sampling_rate,
        double lowest_frequency, double highest_frequency, double floor)
    : num_order_(num_order),
      liftering_coefficient_(liftering_coefficient),
      mel_filter_bank_analysis_(fft_length, num_channel, sampling_rate,
                                lowest_frequency, highest_frequency, floor,
                                false),
      discrete_cosine_transform_(num_channel),
      is_valid_(true) {
  if (num_channel <= num_order_ || liftering_coefficient_ <= 0 ||
      !mel_filter_bank_analysis_.IsValid() ||
      !discrete_cosine_transform_.IsValid()) {
    is_valid_ = false;
    return;
  }

  cepstal_weights_.resize(num_order_);
  double* w(&(cepstal_weights_[0]));
  for (int m(0); m < num_order_; ++m) {
    const double theta(sptk::kPi * (m + 1) / liftering_coefficient_);
    w[m] = 1.0 + 0.5 * liftering_coefficient_ * std::sin(theta);
  }
}